

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-parser.cpp
# Opt level: O0

void __thiscall yactfr::internal::TsdlParser::_parseMetadata(TsdlParser *this)

{
  TextLocation loc;
  TextLocation loc_00;
  bool bVar1;
  TextLocation local_b8;
  allocator local_91;
  string local_90;
  TextLocation local_70;
  allocator local_51;
  string local_50;
  undefined1 local_20 [8];
  _LexicalScope lexScope;
  TsdlParser *this_local;
  
  lexScope._8_8_ = this;
  _LexicalScope::_LexicalScope((_LexicalScope *)local_20,this,Root);
  do {
    bVar1 = _tryParseRootBlock(this);
  } while (bVar1);
  _skipCommentsAndWhitespacesAndSemicolons(this);
  bVar1 = StrScanner::isDone(&this->_ss);
  if (bVar1) {
    bVar1 = boost::optional<yactfr::internal::PseudoTraceType>::operator!(&this->_pseudoTraceType);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_90,"Missing `trace` block.",&local_91);
      local_b8._offset = 0;
      local_b8._lineNumber = 0;
      local_b8._colNumber = 0;
      TextLocation::TextLocation(&local_b8);
      loc_00._lineNumber = local_b8._lineNumber;
      loc_00._offset = local_b8._offset;
      loc_00._colNumber = local_b8._colNumber;
      throwTextParseError(&local_90,loc_00);
    }
    _createTraceType(this);
    _LexicalScope::~_LexicalScope((_LexicalScope *)local_20);
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,
             "Expecting data type alias (`typealias`, `typedef`, `enum NAME`, `struct NAME`, or `variant NAME`), trace type block (`trace`), trace environment block (`env`), clock type block (`clock`), data stream type block (`stream`), or event record type block (`event`). Did you forget the `;` after the closing `}` of the block?"
             ,&local_51);
  StrScanner::loc(&local_70,&this->_ss);
  loc._lineNumber = local_70._lineNumber;
  loc._offset = local_70._offset;
  loc._colNumber = local_70._colNumber;
  throwTextParseError(&local_50,loc);
}

Assistant:

void TsdlParser::_parseMetadata()
{
    _LexicalScope lexScope {*this, _tStackFrame::Kind::Root};

    while (this->_tryParseRootBlock());

    // make sure we skip the remaining fruitless stuff
    this->_skipCommentsAndWhitespacesAndSemicolons();

    if (!_ss.isDone()) {
        throwTextParseError("Expecting data type alias (`typealias`, `typedef`, `enum NAME`, "
                            "`struct NAME`, or `variant NAME`), trace type block (`trace`), "
                            "trace environment block (`env`), "
                            "clock type block (`clock`), data stream type block (`stream`), "
                            "or event record type block (`event`). Did you forget the `;` "
                            "after the closing `}` of the block?",
                            _ss.loc());
    }

    if (!_pseudoTraceType) {
        throwTextParseError("Missing `trace` block.");
    }

    // create a yactfr trace type from the pseudo trace type
    this->_createTraceType();
}